

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O1

Status __thiscall
leveldb::ReadBlock(leveldb *this,RandomAccessFile *file,ReadOptions *options,BlockHandle *handle,
                  BlockContents *result)

{
  ulong uVar1;
  int iVar2;
  uint64_t uVar3;
  char *pcVar4;
  uint32_t uVar5;
  char *pcVar6;
  bool bVar7;
  Status s;
  Slice contents;
  char *local_80;
  leveldb *local_78;
  Status local_70;
  ReadOptions *local_68;
  Slice local_60;
  Slice local_50;
  char *local_40;
  ulong local_38;
  
  (result->data).data_ = "";
  (result->data).size_ = 0;
  result->cachable = false;
  result->heap_allocated = false;
  uVar3 = handle->size_;
  uVar1 = uVar3 + 5;
  local_68 = options;
  pcVar6 = (char *)operator_new__(uVar1);
  local_40 = "";
  local_38 = 0;
  (*file->_vptr_RandomAccessFile[2])(&local_80,file,handle->offset_,uVar1,&local_40,pcVar6);
  pcVar4 = local_40;
  if (local_80 == (char *)0x0) {
    local_78 = this;
    if (local_38 != uVar1) {
      operator_delete__(pcVar6);
      this = local_78;
      local_50.data_ = "truncated block read";
      local_50.size_ = 0x14;
      local_60.data_ = "";
      local_60.size_ = 0;
      Status::Status((Status *)local_78,kCorruption,&local_50,&local_60);
      goto LAB_00110cb8;
    }
    if ((local_68->verify_checksums != true) ||
       (iVar2 = *(int *)(local_40 + uVar3 + 1), uVar5 = crc32c::Extend(0,local_40,uVar3 + 1),
       uVar5 == ((iVar2 + 0x5d7d1528U) * 0x8000 | iVar2 + 0x5d7d1528U >> 0x11))) {
      if (pcVar4[uVar3] == '\x01') {
        operator_delete__(pcVar6);
        this = local_78;
        local_50.data_ = "corrupted compressed block contents";
        local_50.size_ = 0x23;
        local_60.data_ = "";
        local_60.size_ = 0;
        Status::Status((Status *)local_78,kCorruption,&local_50,&local_60);
      }
      else if (pcVar4[uVar3] == '\0') {
        bVar7 = pcVar4 == pcVar6;
        if (!bVar7) {
          operator_delete__(pcVar6);
          pcVar6 = pcVar4;
        }
        (result->data).data_ = pcVar6;
        (result->data).size_ = uVar3;
        result->heap_allocated = bVar7;
        result->cachable = bVar7;
        *(undefined8 *)local_78 = 0;
        this = local_78;
      }
      else {
        operator_delete__(pcVar6);
        this = local_78;
        local_50.data_ = "bad block type";
        local_50.size_ = 0xe;
        local_60.data_ = "";
        local_60.size_ = 0;
        Status::Status((Status *)local_78,kCorruption,&local_50,&local_60);
      }
      goto LAB_00110cb8;
    }
    operator_delete__(pcVar6);
    local_50.data_ = "block checksum mismatch";
    local_50.size_ = 0x17;
    local_60.data_ = "";
    local_60.size_ = 0;
    Status::Status(&local_70,kCorruption,&local_50,&local_60);
    bVar7 = local_80 != (char *)0x0;
    pcVar6 = local_80;
    this = local_78;
    local_80 = local_70.state_;
    if (bVar7) goto LAB_00110ac4;
  }
  else {
LAB_00110ac4:
    operator_delete__(pcVar6);
  }
  *(char **)this = local_80;
  local_80 = (char *)0x0;
LAB_00110cb8:
  if (local_80 != (char *)0x0) {
    operator_delete__(local_80);
  }
  return (Status)(char *)this;
}

Assistant:

Status ReadBlock(RandomAccessFile* file, const ReadOptions& options,
                 const BlockHandle& handle, BlockContents* result) {
  result->data = Slice();
  result->cachable = false;
  result->heap_allocated = false;

  // Read the block contents as well as the type/crc footer.
  // See table_builder.cc for the code that built this structure.
  size_t n = static_cast<size_t>(handle.size());
  char* buf = new char[n + kBlockTrailerSize];
  Slice contents;
  Status s = file->Read(handle.offset(), n + kBlockTrailerSize, &contents, buf);
  if (!s.ok()) {
    delete[] buf;
    return s;
  }
  if (contents.size() != n + kBlockTrailerSize) {
    delete[] buf;
    return Status::Corruption("truncated block read");
  }

  // Check the crc of the type and the block contents
  const char* data = contents.data();  // Pointer to where Read put the data
  if (options.verify_checksums) {
    const uint32_t crc = crc32c::Unmask(DecodeFixed32(data + n + 1));
    const uint32_t actual = crc32c::Value(data, n + 1);
    if (actual != crc) {
      delete[] buf;
      s = Status::Corruption("block checksum mismatch");
      return s;
    }
  }

  switch (data[n]) {
    case kNoCompression:
      if (data != buf) {
        // File implementation gave us pointer to some other data.
        // Use it directly under the assumption that it will be live
        // while the file is open.
        delete[] buf;
        result->data = Slice(data, n);
        result->heap_allocated = false;
        result->cachable = false;  // Do not double-cache
      } else {
        result->data = Slice(buf, n);
        result->heap_allocated = true;
        result->cachable = true;
      }

      // Ok
      break;
    case kSnappyCompression: {
      size_t ulength = 0;
      if (!port::Snappy_GetUncompressedLength(data, n, &ulength)) {
        delete[] buf;
        return Status::Corruption("corrupted compressed block contents");
      }
      char* ubuf = new char[ulength];
      if (!port::Snappy_Uncompress(data, n, ubuf)) {
        delete[] buf;
        delete[] ubuf;
        return Status::Corruption("corrupted compressed block contents");
      }
      delete[] buf;
      result->data = Slice(ubuf, ulength);
      result->heap_allocated = true;
      result->cachable = true;
      break;
    }
    default:
      delete[] buf;
      return Status::Corruption("bad block type");
  }

  return Status::OK();
}